

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_streamable<trng::uniform01_dist<double>>(uniform01_dist<double> *d)

{
  param_type p_new;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  param_type local_219;
  StringRef local_218;
  AssertionHandler local_208;
  StringRef local_1c0;
  SourceLineInfo local_1b0;
  stringstream local_1a0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  trng::operator<<(local_190,(param_type *)&local_208);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a0,&local_219);
  local_218.m_start = "REQUIRE";
  local_218.m_size = 7;
  local_1b0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b0.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c0,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler(&local_208,&local_218,&local_1b0,local_1c0,Normal);
  local_218.m_start = (char *)CONCAT71(local_218.m_start._1_7_,1);
  Catch::AssertionHandler::handleExpr<bool>(&local_208,(ExprLhs<bool> *)&local_218);
  Catch::AssertionHandler::complete(&local_208);
  if (local_208.m_completed == false) {
    (*(local_208.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}